

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void txfm_partition_update
               (TXFM_CONTEXT *above_ctx,TXFM_CONTEXT *left_ctx,TX_SIZE tx_size,TX_SIZE txb_size)

{
  byte bVar1;
  byte bVar2;
  TXFM_CONTEXT TVar3;
  undefined4 uVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar5;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [txsize_to_bsize[CONCAT71(in_register_00000009,txb_size) & 0xffffffff]];
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [txsize_to_bsize[CONCAT71(in_register_00000009,txb_size) & 0xffffffff]];
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
  uVar4 = *(undefined4 *)((long)tx_size_wide + uVar5);
  TVar3 = *(TXFM_CONTEXT *)((long)tx_size_high + uVar5);
  for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
    left_ctx[uVar5] = TVar3;
  }
  for (uVar5 = 0; bVar2 != uVar5; uVar5 = uVar5 + 1) {
    above_ctx[uVar5] = (TXFM_CONTEXT)uVar4;
  }
  return;
}

Assistant:

static inline void txfm_partition_update(TXFM_CONTEXT *above_ctx,
                                         TXFM_CONTEXT *left_ctx,
                                         TX_SIZE tx_size, TX_SIZE txb_size) {
  BLOCK_SIZE bsize = txsize_to_bsize[txb_size];
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];
  uint8_t txw = tx_size_wide[tx_size];
  uint8_t txh = tx_size_high[tx_size];
  int i;
  for (i = 0; i < bh; ++i) left_ctx[i] = txh;
  for (i = 0; i < bw; ++i) above_ctx[i] = txw;
}